

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallRuntimeDependencySetGenerator.cxx
# Opt level: O2

void __thiscall
cmInstallRuntimeDependencySetGenerator::GenerateStripFixup
          (cmInstallRuntimeDependencySetGenerator *this,ostream *os,string *config,string *depName,
          Indent indent)

{
  cmMakefile *pcVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  string strip;
  string local_b0;
  string local_90;
  string local_70 [8];
  long local_68;
  string local_50;
  
  pcVar1 = this->LocalGenerator->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,"CMAKE_STRIP",(allocator<char> *)&local_90);
  psVar3 = cmMakefile::GetSafeDefinition(pcVar1,&local_b0);
  std::__cxx11::string::string(local_70,(string *)psVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  if (local_68 != 0) {
    poVar4 = ::operator<<(os,(cmScriptGeneratorIndent)indent.Level);
    poVar4 = std::operator<<(poVar4,"if(CMAKE_INSTALL_DO_STRIP)\n");
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)(indent.Level + 2));
    poVar4 = std::operator<<(poVar4,"execute_process(COMMAND \"");
    poVar4 = std::operator<<(poVar4,local_70);
    std::operator<<(poVar4,"\" ");
    pcVar1 = this->LocalGenerator->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b0,"APPLE",(allocator<char> *)&local_90);
    bVar2 = cmMakefile::IsOn(pcVar1,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    if (bVar2) {
      std::operator<<(os,"-x ");
    }
    poVar4 = std::operator<<(os,"\"");
    GetDestination(&local_50,this,config);
    cmInstallGenerator::ConvertToAbsoluteDestination(&local_90,&local_50);
    cmInstallGenerator::GetDestDirPath(&local_b0,&local_90);
    poVar4 = std::operator<<(poVar4,(string *)&local_b0);
    poVar4 = std::operator<<(poVar4,"/");
    poVar4 = std::operator<<(poVar4,(string *)depName);
    poVar4 = std::operator<<(poVar4,"\")\n");
    poVar4 = ::operator<<(poVar4,(cmScriptGeneratorIndent)indent.Level);
    std::operator<<(poVar4,"endif()\n");
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::~string(local_70);
  return;
}

Assistant:

void cmInstallRuntimeDependencySetGenerator::GenerateStripFixup(
  std::ostream& os, const std::string& config, const std::string& depName,
  Indent indent)
{
  std::string strip =
    this->LocalGenerator->GetMakefile()->GetSafeDefinition("CMAKE_STRIP");
  if (!strip.empty()) {
    os << indent << "if(CMAKE_INSTALL_DO_STRIP)\n"
       << indent.Next() << "execute_process(COMMAND \"" << strip << "\" ";
    if (this->LocalGenerator->GetMakefile()->IsOn("APPLE")) {
      os << "-x ";
    }
    os << "\""
       << GetDestDirPath(
            ConvertToAbsoluteDestination(this->GetDestination(config)))
       << "/" << depName << "\")\n"
       << indent << "endif()\n";
  }
}